

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall pbrt::PixelStatsAccumulator::PixelStatsAccumulator(PixelStatsAccumulator *this)

{
  PixelStats *this_00;
  
  this->stats = (PixelStats *)0x0;
  this_00 = (PixelStats *)operator_new(0x178);
  PixelStats::PixelStats(this_00);
  this->stats = this_00;
  return;
}

Assistant:

PixelStatsAccumulator::PixelStatsAccumulator() {
    stats = new PixelStats;
}